

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O2

void __thiscall despot::Adventurer::PrintState(Adventurer *this,State *s,ostream *out)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  int x;
  ulong uVar4;
  char buffer [20];
  char acStack_48 [24];
  
  for (uVar4 = 0; iVar1 = this->size_, (long)uVar4 < (long)iVar1; uVar4 = uVar4 + 1) {
    uVar2 = (long)*(int *)(s + 0xc) % (long)iVar1 & 0xffffffff;
    if (uVar4 == iVar1 - 1) {
      if (uVar4 == uVar2) {
        pcVar3 = "T";
      }
      else {
        pcVar3 = "G";
      }
      sprintf(acStack_48,"%s%-2.2d",pcVar3,(long)*(int *)(s + 0xc) / (long)iVar1 & 0xffffffff);
      pcVar3 = acStack_48;
    }
    else {
      pcVar3 = "R     ";
      if (uVar4 != uVar2) {
        sprintf(acStack_48,"%4.3f ",
                (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4]);
        pcVar3 = acStack_48;
      }
    }
    std::operator<<(out,pcVar3);
  }
  std::endl<char,std::char_traits<char>>(out);
  return;
}

Assistant:

void Adventurer::PrintState(const State& s, ostream& out) const {
	const AdventurerState& state = static_cast<const AdventurerState&>(s);

	char buffer[20];
	for (int x = 0; x < size_; x++) {
		if (x == size_ - 1) {
			if (state.state_id % size_ == x) {
				sprintf(buffer, "%s%-2.2d", "T", state.state_id / size_);
				out << buffer;
			} else {
				sprintf(buffer, "%s%-2.2d", "G", state.state_id / size_);
				out << buffer;
			}
		} else {
			if (state.state_id % size_ == x)
				out << "R     ";
			else {
				sprintf(buffer, "%4.3f ", trap_prob_[x]);
				out << buffer;
			}
		}
	}
	out << endl;
}